

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

pair<QPDFObjectHandle,_bool> *
QPDFParser::parse(pair<QPDFObjectHandle,_bool> *__return_storage_ptr__,InputSource *input,
                 string *object_description,Tokenizer *tokenizer,StringDecrypter *decrypter,
                 QPDF *context)

{
  int iVar1;
  undefined4 extraout_var;
  bool empty;
  QPDFObjectHandle result;
  bool local_f9;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  QPDFParser local_d8;
  
  local_f9 = false;
  iVar1 = (*input->_vptr_InputSource[3])(input);
  make_description((QPDFParser *)(local_f8 + 0x10),(string *)CONCAT44(extraout_var,iVar1),
                   object_description);
  local_d8.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_f8._16_8_;
  local_d8.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Stack_e0._M_pi;
  local_d8.parse_pdf = true;
  local_d8.stream_id = 0;
  local_d8.obj_id = 0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.frame = (StackFrame *)0x0;
  local_d8.bad_count = 0;
  local_d8._108_8_ = 0xf;
  local_d8.start = 0;
  local_d8.int_count = 0;
  local_f8._16_8_ = (Tokenizer *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.int_buffer[0] = 0;
  local_d8.int_buffer[1] = 0;
  local_d8.last_offset_buffer[0] = 0;
  local_d8.last_offset_buffer[1] = 0;
  local_d8.input = input;
  local_d8.object_description = object_description;
  local_d8.tokenizer = tokenizer;
  local_d8.decrypter = decrypter;
  local_d8.context = context;
  parse((QPDFParser *)local_f8,(bool *)&local_d8,SUB81(&local_f9,0));
  ~QPDFParser(&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_f8);
  __return_storage_ptr__->second = local_f9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<QPDFObjectHandle, bool>
QPDFParser::parse(
    InputSource& input,
    std::string const& object_description,
    qpdf::Tokenizer& tokenizer,
    QPDFObjectHandle::StringDecrypter* decrypter,
    QPDF& context)
{
    bool empty{false};
    auto result = QPDFParser(
                      input,
                      make_description(input.getName(), object_description),
                      object_description,
                      tokenizer,
                      decrypter,
                      &context,
                      true)
                      .parse(empty, false);
    return {result, empty};
}